

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

Gia_Man_t * Lf_ManPerformMappingInt(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  Vec_Mem_t *p_00;
  int iVar1;
  Lf_Man_t *p_01;
  char *pName;
  Gia_Man_t *local_38;
  Gia_Man_t *pCls;
  Gia_Man_t *pNew;
  Lf_Man_t *p;
  int fUsePowerMode;
  Jf_Par_t *pPars_local;
  Gia_Man_t *pGia_local;
  
  if (pPars->fUseMux7 != 0) {
    pPars->fCoarsen = 1;
    pPars->nRoundsEla = 0;
  }
  iVar1 = Gia_ManHasChoices(pGia);
  if ((iVar1 != 0) || (pPars->nLutSizeMux != 0)) {
    pPars->fCutMin = 1;
  }
  local_38 = pGia;
  if (pPars->fCoarsen != 0) {
    local_38 = Gia_ManDupMuxes(pGia,pPars->nCoarseLimit);
    local_38->pManTime = pGia->pManTime;
    pGia->pManTime = (void *)0x0;
  }
  p_01 = Lf_ManAlloc(local_38,pPars);
  if ((pPars->fVerbose != 0) && (pPars->fCoarsen != 0)) {
    printf("Initial ");
    Gia_ManPrintMuxStats(pGia);
    printf("\n");
    printf("Derived ");
    Gia_ManPrintMuxStats(local_38);
    printf("\n");
  }
  Lf_ManPrintInit(p_01);
  p_01->Iter = 0;
  while (p_01->Iter < p_01->pPars->nRounds) {
    Lf_ManComputeMapping(p_01);
    p_01->Iter = p_01->Iter + 1;
  }
  p_01->fUseEla = 1;
  while (p_01->Iter < p_01->pPars->nRounds + pPars->nRoundsEla) {
    Lf_ManComputeMapping(p_01);
    p_01->Iter = p_01->Iter + 1;
  }
  if ((pPars->fVeryVerbose != 0) && (pPars->fCutMin != 0)) {
    p_00 = p_01->vTtMem;
    pName = Gia_ManName(p_01->pGia);
    Vec_MemDumpTruthTables(p_00,pName,pPars->nLutSize);
  }
  if (pPars->fCutMin == 0) {
    if (pPars->fCoarsen == 0) {
      pCls = Lf_ManDeriveMapping(p_01);
    }
    else {
      pCls = Lf_ManDeriveMappingCoarse(p_01);
    }
  }
  else {
    pCls = Lf_ManDeriveMappingGia(p_01);
  }
  Gia_ManMappingVerify(pCls);
  Lf_ManPrintQuit(p_01,pCls);
  Lf_ManFree(p_01);
  if (local_38 != pGia) {
    pGia->pManTime = local_38->pManTime;
    local_38->pManTime = (void *)0x0;
    Gia_ManStop(local_38);
  }
  return pCls;
}

Assistant:

Gia_Man_t * Lf_ManPerformMappingInt( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    int fUsePowerMode = 0;
    Lf_Man_t * p;
    Gia_Man_t * pNew, * pCls;
    if ( pPars->fUseMux7 )
        pPars->fCoarsen = 1, pPars->nRoundsEla = 0;
    if ( Gia_ManHasChoices(pGia) || pPars->nLutSizeMux )
        pPars->fCutMin = 1; 
    if ( pPars->fCoarsen )
    {
        pCls = Gia_ManDupMuxes(pGia, pPars->nCoarseLimit);
        pCls->pManTime = pGia->pManTime; pGia->pManTime = NULL;
    }
    else pCls = pGia;
    p = Lf_ManAlloc( pCls, pPars );
    if ( pPars->fVerbose && pPars->fCoarsen )
    {
        printf( "Initial " );  Gia_ManPrintMuxStats( pGia );  printf( "\n" );
        printf( "Derived " );  Gia_ManPrintMuxStats( pCls );  printf( "\n" );
    }
    Lf_ManPrintInit( p );

    // power mode
    if ( fUsePowerMode && Vec_FltSize(&p->vSwitches) )
        pPars->fPower = 0;

    // perform mapping
    for ( p->Iter = 0; p->Iter < p->pPars->nRounds; p->Iter++ )
        Lf_ManComputeMapping( p );
    p->fUseEla = 1;
    for ( ; p->Iter < p->pPars->nRounds + pPars->nRoundsEla; p->Iter++ )
        Lf_ManComputeMapping( p );

    // power mode
    if ( fUsePowerMode && Vec_FltSize(&p->vSwitches) )
    {
        pPars->fPower = 1;
        for ( ; p->Iter < p->pPars->nRounds + pPars->nRoundsEla + 2; p->Iter++ )
            Lf_ManComputeMapping( p );
    }

    if ( pPars->fVeryVerbose && pPars->fCutMin )
        Vec_MemDumpTruthTables( p->vTtMem, Gia_ManName(p->pGia), pPars->nLutSize );
    if ( pPars->fCutMin )
        pNew = Lf_ManDeriveMappingGia( p );
    else if ( pPars->fCoarsen )
        pNew = Lf_ManDeriveMappingCoarse( p );
    else
        pNew = Lf_ManDeriveMapping( p );
    Gia_ManMappingVerify( pNew );
    Lf_ManPrintQuit( p, pNew );
    Lf_ManFree( p );
    if ( pCls != pGia )
    {
        pGia->pManTime = pCls->pManTime; pCls->pManTime = NULL;
        Gia_ManStop( pCls );
    }
    return pNew;
}